

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQL.cpp
# Opt level: O2

void __thiscall SQL::SQL(SQL *this)

{
  SQL *this_00;
  
  this->TABLES_FILE = "tables.txt";
  Parser::Parser(&this->parser);
  this_00 = (SQL *)&this->tables;
  Map::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>::
  Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table> *
      )this_00);
  this->UNKNOWN_TABLE = "Error: Unknown table see \"tables\" for available tables";
  this->ILLEGAL_NAME = "Error: Illegal table name";
  print_welcome(this_00);
  get_tables(this);
  return;
}

Assistant:

SQL::SQL() {
    print_welcome();
    get_tables();
    // if (tables.contains(Table::TEMP))
    //     execute_string("DROP TABLE " + std::string(Table::TEMP));
}